

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_encoder.cc
# Opt level: O2

Status * __thiscall
draco::MeshEncoder::EncodeGeometryData(Status *__return_storage_ptr__,MeshEncoder *this)

{
  EncoderOptions *this_00;
  bool bVar1;
  Status *_local_status;
  allocator<char> local_49;
  string local_48;
  
  (*(this->super_PointCloudEncoder)._vptr_PointCloudEncoder[0x10])();
  if (__return_storage_ptr__->code_ == OK) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
    this_00 = (this->super_PointCloudEncoder).options_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"store_number_of_encoded_faces",&local_49);
    bVar1 = Options::GetBool((Options *)this_00,&local_48,false);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      (*(this->super_PointCloudEncoder)._vptr_PointCloudEncoder[0x11])(this);
    }
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Status MeshEncoder::EncodeGeometryData() {
  DRACO_RETURN_IF_ERROR(EncodeConnectivity());
  if (options()->GetGlobalBool("store_number_of_encoded_faces", false)) {
    ComputeNumberOfEncodedFaces();
  }
  return OkStatus();
}